

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool ParseInt32(string_view str,int32_t *out)

{
  long lVar1;
  string_view str_00;
  bool bVar2;
  char *in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_00._M_str = in_RSI;
  str_00._M_len = in_RDI;
  bVar2 = anon_unknown.dwarf_f048e7::ParseIntegral<int>
                    (str_00,(int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseInt32(std::string_view str, int32_t* out)
{
    return ParseIntegral<int32_t>(str, out);
}